

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::segment_data(ostream *out,Elf_Half no,segment *seg)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ostream oVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Segment # ",10);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  iVar6 = (*seg->_vptr_segment[0x12])(seg);
  if (CONCAT44(extraout_var,iVar6) != 0) {
    iVar7 = (*seg->_vptr_segment[0xd])(seg);
    if (CONCAT44(extraout_var_00,iVar7) != 0) {
      uVar10 = 0;
      do {
        if ((uVar10 & 0xf) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
          lVar2 = *(long *)out;
          *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 8;
          lVar2 = *(long *)(lVar2 + -0x18);
          poVar8 = out + lVar2;
          if (out[lVar2 + 0xe1] == (ostream)0x0) {
            oVar5 = (ostream)std::ios::widen((char)poVar8);
            poVar8[0xe0] = oVar5;
            poVar8[0xe1] = (ostream)0x1;
          }
          poVar8[0xe0] = (ostream)0x30;
          lVar2 = *(long *)out;
          lVar3 = *(long *)(lVar2 + -0x18);
          *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 8;
          lVar2 = *(long *)(lVar2 + -0x18);
          *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x80;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
        lVar2 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        lVar2 = *(long *)(lVar2 + -0x18);
        poVar8 = out + lVar2;
        if (out[lVar2 + 0xe1] == (ostream)0x0) {
          oVar5 = (ostream)std::ios::widen((char)poVar8);
          poVar8[0xe0] = oVar5;
          poVar8[0xe1] = (ostream)0x1;
        }
        poVar8[0xe0] = (ostream)0x30;
        lVar2 = *(long *)out;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 8;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x80;
        std::ostream::operator<<
                  ((ostream *)out,(uint)*(byte *)(CONCAT44(extraout_var,iVar6) + uVar10));
        cVar4 = (char)out;
        if ((int)(uVar10 & 0xf) == 0xf) {
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        uVar10 = uVar10 + 1;
        iVar7 = (*seg->_vptr_segment[0xd])(seg);
        uVar9 = CONCAT44(extraout_var_01,iVar7);
        if (0x3f < uVar9) {
          uVar9 = 0x40;
        }
      } while (uVar10 < uVar9);
      if ((uVar10 & 0xf) != 0) {
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
      }
    }
    *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  }
  return;
}

Assistant:

static void
    segment_data( std::ostream& out, Elf_Half no, const segment* seg )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        out << "Segment # " << no << std::endl;
        const char* pdata = seg->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i;
            for ( i = 0; i < std::min( seg->get_file_size(), MAX_DATA_ENTRIES );
                  ++i ) {
                if ( i % 16 == 0 ) {
                    out << "[" << DUMP_HEX0x_FORMAT( 8 ) << i << "]";
                }

                out << " " << DUMP_HEX0x_FORMAT( 2 )
                    << ( pdata[i] & 0x000000FF );

                if ( i % 16 == 15 ) {
                    out << std::endl;
                }
            }
            if ( i % 16 != 0 ) {
                out << std::endl;
            }

            out.flags( original_flags );
        }

        return;
    }